

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set_string.c
# Opt level: O0

int iterConv(mpt_convertable *conv,mpt_type_t type,void *dest)

{
  size_t sVar1;
  int ret;
  iovec *vec;
  mpt_metatype *src;
  wrapIter *it;
  void *dest_local;
  mpt_type_t type_local;
  mpt_convertable *conv_local;
  
  if (type == 0) {
    if (dest == (void *)0x0) {
      conv_local._4_4_ = 0x86;
    }
    else {
      *(uint8_t **)dest = iterConv::fmt;
      conv_local._4_4_ = 0;
    }
  }
  else if ((type == 0x86) || (type == 0x100)) {
    if (dest == (void *)0x0) {
      conv_local._4_4_ = 0x73;
    }
    else if ((conv[2]._vptr == (_mpt_vptr_convertable *)0x0) ||
            (*(char *)&(conv[2]._vptr)->convert == '\0')) {
      conv_local._4_4_ = -2;
    }
    else {
      vec = (iovec *)conv[1]._vptr;
      if (vec == (iovec *)0x0) {
        vec = (iovec *)mpt_iterator_string((char *)conv[2]._vptr,(char *)conv[3]._vptr);
        if (vec == (iovec *)0x0) {
          return -2;
        }
        conv[1]._vptr = (_mpt_vptr_convertable *)vec;
      }
      conv_local._4_4_ = (**vec->iov_base)(vec,type,dest);
    }
  }
  else if (type == 0x43) {
    if (dest != (void *)0x0) {
      *(_mpt_vptr_convertable **)dest = conv[2]._vptr;
      sVar1 = strlen((char *)conv[2]._vptr);
      *(size_t *)((long)dest + 8) = sVar1;
    }
    conv_local._4_4_ = 0x73;
  }
  else if (type == 0x73) {
    if (dest != (void *)0x0) {
      *(_mpt_vptr_convertable **)dest = conv[2]._vptr;
    }
    conv_local._4_4_ = 0x73;
  }
  else if (conv[2]._vptr == (_mpt_vptr_convertable *)0x0) {
    conv_local._4_4_ = 0;
  }
  else {
    conv_local._4_4_ = mpt_convert_string((char *)conv[2]._vptr,type,dest);
    if (-1 < conv_local._4_4_) {
      conv_local._4_4_ = 0x73;
    }
  }
  return conv_local._4_4_;
}

Assistant:

static int iterConv(MPT_INTERFACE(convertable) *conv, MPT_TYPE(type) type, void *dest)
{
	struct wrapIter *it = (void *) conv;
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeIteratorPtr), 's', 0 };
		if (dest) {
			*((const uint8_t **) dest) = fmt;
			return 0;
		}
		return MPT_ENUM(TypeIteratorPtr);
	}
	if (type == MPT_ENUM(TypeIteratorPtr) || type == MPT_ENUM(TypeMetaPtr)) {
		if (dest) {
			MPT_INTERFACE(metatype) *src;
			if (!it->val || !*it->val) {
				return MPT_ERROR(BadValue);
			}
			if (!(src = it->src)) {
				if (!(src = mpt_iterator_string(it->val, it->sep))) {
					return MPT_ERROR(BadValue);
				}
				it->src = src;
			}
			return MPT_metatype_convert(src, type, dest);
		}
		return 's';
	}
	if (type == MPT_type_toVector('c')) {
		struct iovec *vec;
		if ((vec = dest)) {
			vec->iov_base = (void *) it->val;
			vec->iov_len = strlen(it->val);
		}
		return 's';
	}
	if (type == 's') {
		if (dest) {
			*((const char **) dest) = it->val;
		}
		return 's';
	}
	if (it->val) {
		int ret = mpt_convert_string(it->val, type, dest);
		if (ret < 0) {
			return ret;
		}
		return 's';
	}
	return 0;
}